

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.cpp
# Opt level: O1

void remove_mon(coord *mp,MonsterThing *tp,bool waskill)

{
  list<ItemThing_*,_std::allocator<ItemThing_*>_> *plVar1;
  int x;
  int y;
  _List_node_base *p_Var2;
  MonsterThing *pMVar3;
  bool bVar4;
  int display_char;
  _Self __tmp;
  _List_node_base *p_Var5;
  ItemThing *obj;
  MonsterThing *local_30;
  ItemThing *local_28;
  
  p_Var5 = (tp->pack).super__List_base<ItemThing_*,_std::allocator<ItemThing_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  local_30 = tp;
  if (p_Var5 != (_List_node_base *)&tp->pack) {
    do {
      local_28 = (ItemThing *)p_Var5[1]._M_next;
      p_Var5 = p_Var5->_M_next;
      local_28->pos = local_30->pos;
      std::__cxx11::list<ItemThing_*,_std::allocator<ItemThing_*>_>::remove
                (&local_30->pack,(char *)&local_28);
      if (waskill) {
        fall(local_28,false);
      }
      else if (local_28 != (ItemThing *)0x0) {
        operator_delete(local_28);
      }
    } while (p_Var5 != (_List_node_base *)&local_30->pack);
  }
  places[(long)(mp->x << 5) + (long)mp->y].p_monst = (MonsterThing *)0x0;
  std::__cxx11::list<MonsterThing_*,_std::allocator<MonsterThing_*>_>::remove
            (&mlist_abi_cxx11_,(char *)&local_30);
  bVar4 = see_monst(local_30);
  if (bVar4) {
    x = mp->x;
    y = mp->y;
    display_char = char_at_place(x,y);
    setMapDisplay(x,y,display_char);
  }
  if ((local_30->flags & 0x80) != 0) {
    kamikaze = false;
    to_death = false;
    if (fight_flush == true) {
      flush_type();
    }
  }
  pMVar3 = local_30;
  if (local_30 != (MonsterThing *)0x0) {
    plVar1 = &local_30->pack;
    p_Var5 = (local_30->pack).super__List_base<ItemThing_*,_std::allocator<ItemThing_*>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    while (p_Var5 != (_List_node_base *)plVar1) {
      p_Var2 = p_Var5->_M_next;
      operator_delete(p_Var5);
      p_Var5 = p_Var2;
    }
    operator_delete(pMVar3);
  }
  return;
}

Assistant:

void remove_mon(coord *mp, MonsterThing *tp, bool waskill)
{
    for(auto it = tp->pack.begin(); it != tp->pack.end(); )
    {
        ItemThing* obj = *it++;
        obj->pos = tp->pos;
        tp->pack.remove(obj);
        if (waskill)
            fall(obj, false);
        else
            delete obj;
    }
    monster_at(mp->x, mp->y) = nullptr;
    mlist.remove(tp);
    if (see_monst(tp))
        setMapDisplay(mp->x, mp->y, char_at_place(mp->x, mp->y));
    if (on(*tp, ISTARGET))
    {
        kamikaze = false;
        to_death = false;
        if (fight_flush)
            flush_type();
    }
    delete tp;
}